

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.h
# Opt level: O3

int64_t __thiscall icu_63::CollationIterator::nextCE(CollationIterator *this,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  int iVar3;
  uint ce32;
  uint uVar4;
  ulong uVar5;
  CollationData *this_00;
  UChar32 c;
  int local_1c;
  
  iVar1 = this->cesIndex;
  iVar3 = (this->ceBuffer).length;
  if (iVar1 < iVar3) {
    this->cesIndex = iVar1 + 1;
    return (this->ceBuffer).buffer.ptr[iVar1];
  }
  if (0x27 < iVar3) {
    UVar2 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,1,errorCode);
    if (UVar2 == '\0') {
      return 0x101000100;
    }
    iVar3 = (this->ceBuffer).length;
  }
  (this->ceBuffer).length = iVar3 + 1;
  ce32 = (*(this->super_UObject)._vptr_UObject[8])(this,&local_1c,errorCode);
  uVar4 = ce32 & 0xff;
  if (uVar4 < 0xc0) {
LAB_0022af51:
    iVar1 = this->cesIndex;
    this->cesIndex = iVar1 + 1;
    uVar5 = (ulong)(uVar4 << 8) | CONCAT44(ce32,ce32 << 0x10) & 0xffff0000ff000000;
    (this->ceBuffer).buffer.ptr[iVar1] = uVar5;
  }
  else {
    if (uVar4 == 0xc0) {
      if (local_1c < 0) {
        iVar1 = this->cesIndex;
        this->cesIndex = iVar1 + 1;
        (this->ceBuffer).buffer.ptr[iVar1] = 0x101000100;
        return 0x101000100;
      }
      this_00 = this->data->base;
      ce32 = CollationData::getCE32(this_00,local_1c);
      uVar4 = ce32 & 0xff;
      if (uVar4 < 0xc0) goto LAB_0022af51;
    }
    else {
      this_00 = this->data;
    }
    if (uVar4 == 0xc1) {
      iVar1 = this->cesIndex;
      this->cesIndex = iVar1 + 1;
      uVar5 = (ulong)(ce32 - 0xc1) << 0x20 | 0x5000500;
      (this->ceBuffer).buffer.ptr[iVar1] = uVar5;
    }
    else {
      uVar5 = nextCEFromCE32(this,this_00,local_1c,ce32,errorCode);
    }
  }
  return uVar5;
}

Assistant:

inline int64_t nextCE(UErrorCode &errorCode) {
        if(cesIndex < ceBuffer.length) {
            // Return the next buffered CE.
            return ceBuffer.get(cesIndex++);
        }
        // assert cesIndex == ceBuffer.length;
        if(!ceBuffer.incLength(errorCode)) {
            return Collation::NO_CE;
        }
        UChar32 c;
        uint32_t ce32 = handleNextCE32(c, errorCode);
        uint32_t t = ce32 & 0xff;
        if(t < Collation::SPECIAL_CE32_LOW_BYTE) {  // Forced-inline of isSpecialCE32(ce32).
            // Normal CE from the main data.
            // Forced-inline of ceFromSimpleCE32(ce32).
            return ceBuffer.set(cesIndex++,
                    ((int64_t)(ce32 & 0xffff0000) << 32) | ((ce32 & 0xff00) << 16) | (t << 8));
        }
        const CollationData *d;
        // The compiler should be able to optimize the previous and the following
        // comparisons of t with the same constant.
        if(t == Collation::SPECIAL_CE32_LOW_BYTE) {
            if(c < 0) {
                return ceBuffer.set(cesIndex++, Collation::NO_CE);
            }
            d = data->base;
            ce32 = d->getCE32(c);
            t = ce32 & 0xff;
            if(t < Collation::SPECIAL_CE32_LOW_BYTE) {
                // Normal CE from the base data.
                return ceBuffer.set(cesIndex++,
                        ((int64_t)(ce32 & 0xffff0000) << 32) | ((ce32 & 0xff00) << 16) | (t << 8));
            }
        } else {
            d = data;
        }
        if(t == Collation::LONG_PRIMARY_CE32_LOW_BYTE) {
            // Forced-inline of ceFromLongPrimaryCE32(ce32).
            return ceBuffer.set(cesIndex++,
                    ((int64_t)(ce32 - t) << 32) | Collation::COMMON_SEC_AND_TER_CE);
        }
        return nextCEFromCE32(d, c, ce32, errorCode);
    }